

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

void __thiscall asmjit::_abi_1_10::BaseEmitter::setLogger(BaseEmitter *this,Logger *logger)

{
  undefined1 uVar1;
  
  if (logger != (Logger *)0x0) {
    this->_logger = logger;
    this->_emitterFlags = this->_emitterFlags | kOwnLogger;
    BaseEmitter_updateForcedOptions(this);
    return;
  }
  this->_logger = (Logger *)0x0;
  this->_emitterFlags = this->_emitterFlags & ~kOwnLogger;
  if (this->_code != (CodeHolder *)0x0) {
    this->_logger = this->_code->_logger;
    BaseEmitter_updateForcedOptions(this);
    return;
  }
  if (this->_emitterType == kAssembler) {
    if (this->_code == (CodeHolder *)0x0) {
LAB_0011cc28:
      this->_emitterFlags = this->_emitterFlags & ~kLogComments;
      goto LAB_0011cc2c;
    }
    uVar1 = (char)this->_diagnosticOptions & kValidateAssembler;
    if (this->_logger != (Logger *)0x0) goto LAB_0011cc14;
    this->_emitterFlags = this->_emitterFlags & ~kLogComments;
  }
  else {
    if (this->_code == (CodeHolder *)0x0) goto LAB_0011cc28;
    uVar1 = (byte)((char)this->_diagnosticOptions & kValidateIntermediate) >> 1;
LAB_0011cc14:
    this->_emitterFlags = this->_emitterFlags | kLogComments;
  }
  if ((uVar1 == kNone) && (this->_logger == (Logger *)0x0)) {
    *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions & 0xfe;
    return;
  }
LAB_0011cc2c:
  *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions | kReserved;
  return;
}

Assistant:

void BaseEmitter::setLogger(Logger* logger) noexcept {
#ifndef ASMJIT_NO_LOGGING
  if (logger) {
    _logger = logger;
    _addEmitterFlags(EmitterFlags::kOwnLogger);
  }
  else {
    _logger = nullptr;
    _clearEmitterFlags(EmitterFlags::kOwnLogger);
    if (_code)
      _logger = _code->logger();
  }
  BaseEmitter_updateForcedOptions(this);
#else
  DebugUtils::unused(logger);
#endif
}